

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void code_input_cb(Fl_Input *i,void *param_2)

{
  int iVar1;
  
  if (code_file_name != (char *)0x0) {
    iVar1 = strcmp(code_file_name,(i->super_Fl_Input_).value_);
    if (iVar1 != 0) {
      set_modflag(1);
    }
  }
  code_file_name = (i->super_Fl_Input_).value_;
  return;
}

Assistant:

void code_input_cb(Fl_Input* i, void*) {
  if (code_file_name && strcmp(code_file_name, i->value()))
    set_modflag(1);
  code_file_name = i->value();
}